

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  impbot bot;
  _Any_data local_200;
  code *local_1f0;
  code *local_1e8;
  impbot local_1e0;
  
  impbot::impbot(&local_1e0);
  local_200._8_8_ = 0;
  local_1e8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/impowski[P]l33tbot/src/main.cpp:13:30)>
              ::_M_invoke;
  local_1f0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/impowski[P]l33tbot/src/main.cpp:13:30)>
              ::_M_manager;
  local_200._M_unused._M_object = &local_1e0;
  impbot::add_read_handler
            (&local_1e0,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_200);
  std::_Function_base::~_Function_base((_Function_base *)&local_200);
  impbot::loop(&local_1e0);
  impbot::~impbot(&local_1e0);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    try {
        impbot bot;

        bot.add_read_handler([&bot](const std::string &m){
                istringstream iss(m);
                string from, type, to, body;
                iss >> from >> type >> to >> body;
                if (boost::starts_with(body, ":!time")) {
                    auto now = chrono::system_clock::to_time_t(chrono::system_clock::now());
                    bot.message(to, ctime(&now));
                }
            });

        bot.loop();
    } catch (exception &e) {
        cerr << e.what() << endl;
    }

    return 0;
}